

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misctests.c
# Opt level: O1

void sarimaxtest(void)

{
  int iVar1;
  FILE *__stream;
  double *inp;
  sarimax_object obj;
  ulong uVar2;
  undefined1 *puVar3;
  undefined1 local_25a8 [8];
  double temp [1200];
  
  __stream = fopen("../data/seriesB.txt","r");
  if (__stream != (FILE *)0x0) {
    iVar1 = feof(__stream);
    uVar2 = 0;
    if (iVar1 == 0) {
      puVar3 = local_25a8;
      uVar2 = 0;
      do {
        __isoc99_fscanf(__stream,"%lf \n",puVar3);
        iVar1 = feof(__stream);
        puVar3 = puVar3 + 8;
        uVar2 = (ulong)((int)uVar2 + 1);
      } while (iVar1 == 0);
    }
    inp = (double *)malloc(uVar2 * 8);
    if ((int)uVar2 != 0) {
      memcpy(inp,local_25a8,uVar2 << 3);
    }
    obj = sarimax_init(1,1,1,0,0,0,0,0,1,(int)uVar2);
    sarimax_setMethod(obj,0);
    sarimax_exec(obj,inp,(double *)0x0);
    sarimax_summary(obj);
    putchar(10);
    sarimax_free(obj);
    free(inp);
    return;
  }
  printf("Cannot Open File");
  exit(100);
}

Assistant:

void sarimaxtest() {
	int i, N, d, D, L;
	double *inp;
	int p, q, P, Q, s, r;
	double *phi, *theta;
	double *xreg;
	double *xpred, *amse;
	sarimax_object obj;
	int imean = 1;
	p = 1;
	d = 1;
	q = 1;
	s = 0;
	P = 0;
	D = 0;
	Q = 0;
	r = 0;


	L = 0;

	phi = (double*)malloc(sizeof(double)* p);
	theta = (double*)malloc(sizeof(double)* q);

	xpred = (double*)malloc(sizeof(double)* L);
	amse = (double*)malloc(sizeof(double)* L);

	FILE *ifp;
	double temp[1200];
	double temp2[1200];
	double temp3[1200];

	ifp = fopen("../data/seriesB.txt", "r");
	i = 0;
	if (!ifp) {
		printf("Cannot Open File");
		exit(100);
	}
	while (!feof(ifp)) {
		fscanf(ifp, "%lf \n", &temp[i]);
		i++;
	}
	N = i;

	inp = (double*)malloc(sizeof(double)* N);
	//wmean = mean(temp, N);
	xreg = (double*)malloc(sizeof(double)* N * 2);

	for (i = 0; i < N; ++i) {
		inp[i] = temp[i];
		//xreg[i] = temp2[i];
		//xreg[N+i] = temp3[i];
		//printf("%g \n",inp[i]);
	}


	obj = sarimax_init(p, d, q, P, D, Q, s, r ,imean, N);
	sarimax_setMethod(obj, 0); // Method 0 ("CSS-MLE") is default. The method also accepts values 1 ("MLE") and 2 ("CSS")
	//sarimax_setOptMethod(obj, 5);// Method 7 ("BFGS with More Thuente Line search") is default so this step is unnecessary. The method also accepts values 0,1,2,3,4,5,6. Check the documentation for details.
	sarimax_exec(obj, inp,NULL);
	sarimax_summary(obj);
	// Predict the next 5 values using the obtained ARIMA model
	//arima_predict(obj, inp, L, xpred, amse);
	//printf("\n");
	//printf("Predicted Values : ");
	//for (i = 0; i < L; ++i) {
	//	printf("%g ", xpred[i]);
	//}
	//printf("\n");
	//printf("Standard Errors  : ");
	//for (i = 0; i < L; ++i) {
	//	printf("%g ", sqrt(amse[i]));
	//}
	printf("\n");
	sarimax_free(obj);
	free(inp);
	free(phi);
	free(theta);
	free(xpred);
	free(amse);
	free(xreg);
}